

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferInputSource.cc
# Opt level: O3

void __thiscall BufferInputSource::seek(BufferInputSource *this,qpdf_offset_t offset,int whence)

{
  qpdf_offset_t *cur;
  logic_error *this_00;
  long lVar1;
  runtime_error *this_01;
  qpdf_offset_t local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_48 = offset;
  if (whence == 2) {
    lVar1 = this->max_offset;
    if (0 < offset != lVar1 < 1) {
      QIntC::range_check_error<long_long>(&this->max_offset,&local_48);
      lVar1 = this->max_offset;
    }
    offset = local_48 + lVar1;
  }
  else {
    if (whence == 1) {
      cur = &this->cur_offset;
      lVar1 = this->cur_offset;
      if (0 < offset != lVar1 < 1) {
        QIntC::range_check_error<long_long>(cur,&local_48);
        lVar1 = *cur;
      }
      offset = local_48 + lVar1;
      *cur = offset;
      goto LAB_0011e377;
    }
    if (whence != 0) {
      this_00 = (logic_error *)__cxa_allocate_exception(0x10);
      std::logic_error::logic_error
                (this_00,"INTERNAL ERROR: invalid argument to BufferInputSource::seek");
      __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
    }
  }
  this->cur_offset = offset;
LAB_0011e377:
  if (-1 < offset) {
    return;
  }
  this_01 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::operator+(&local_40,&this->description,": seek before beginning of buffer");
  std::runtime_error::runtime_error(this_01,(string *)&local_40);
  __cxa_throw(this_01,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void
BufferInputSource::seek(qpdf_offset_t offset, int whence)
{
    switch (whence) {
    case SEEK_SET:
        this->cur_offset = offset;
        break;

    case SEEK_END:
        QIntC::range_check(this->max_offset, offset);
        this->cur_offset = this->max_offset + offset;
        break;

    case SEEK_CUR:
        QIntC::range_check(this->cur_offset, offset);
        this->cur_offset += offset;
        break;

    default:
        throw std::logic_error("INTERNAL ERROR: invalid argument to BufferInputSource::seek");
        break;
    }

    if (this->cur_offset < 0) {
        throw std::runtime_error(this->description + ": seek before beginning of buffer");
    }
}